

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O0

void __thiscall StringValueAnalyser::~StringValueAnalyser(StringValueAnalyser *this)

{
  StringValueAnalyser *in_RDI;
  
  ~StringValueAnalyser(in_RDI);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

StringValueAnalyser(): valid_(false), value_() {}